

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_open(uv_fs_t *req)

{
  int iVar1;
  int *piVar2;
  int local_1c;
  int r;
  uv_fs_t *req_local;
  
  if (uv__fs_open::no_cloexec_support == 0) {
    iVar1 = open(req->path,req->flags | 0x80000,(ulong)req->mode);
    if (-1 < iVar1) {
      return (long)iVar1;
    }
    piVar2 = __errno_location();
    if (*piVar2 != 0x16) {
      return (long)iVar1;
    }
    uv__fs_open::no_cloexec_support = 1;
  }
  if (req->cb != (uv_fs_cb)0x0) {
    uv_rwlock_rdlock(&req->loop->cloexec_lock);
  }
  local_1c = open(req->path,req->flags,(ulong)req->mode);
  if ((-1 < local_1c) && (iVar1 = uv__cloexec_ioctl(local_1c,1), iVar1 != 0)) {
    iVar1 = uv__close(local_1c);
    if (iVar1 != 0) {
      abort();
    }
    local_1c = -1;
  }
  if (req->cb != (uv_fs_cb)0x0) {
    uv_rwlock_rdunlock(&req->loop->cloexec_lock);
  }
  return (long)local_1c;
}

Assistant:

static ssize_t uv__fs_open(uv_fs_t* req) {
  static int no_cloexec_support;
  int r;

  /* Try O_CLOEXEC before entering locks */
  if (no_cloexec_support == 0) {
#ifdef O_CLOEXEC
    r = open(req->path, req->flags | O_CLOEXEC, req->mode);
    if (r >= 0)
      return r;
    if (errno != EINVAL)
      return r;
    no_cloexec_support = 1;
#endif  /* O_CLOEXEC */
  }

  if (req->cb != NULL)
    uv_rwlock_rdlock(&req->loop->cloexec_lock);

  r = open(req->path, req->flags, req->mode);

  /* In case of failure `uv__cloexec` will leave error in `errno`,
   * so it is enough to just set `r` to `-1`.
   */
  if (r >= 0 && uv__cloexec(r, 1) != 0) {
    r = uv__close(r);
    if (r != 0)
      abort();
    r = -1;
  }

  if (req->cb != NULL)
    uv_rwlock_rdunlock(&req->loop->cloexec_lock);

  return r;
}